

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

Grammar * __thiscall
xercesc_4_0::DOMLSParserImpl::loadGrammar
          (DOMLSParserImpl *this,char *systemId,GrammarType grammarType,bool toCache)

{
  bool bVar1;
  DOMException *this_00;
  XMLScanner *pXVar2;
  Grammar *pGVar3;
  OutOfMemoryException *anon_var_0;
  Grammar *grammar;
  undefined1 local_48 [8];
  ResetParseType resetParse;
  short local_1c;
  bool toCache_local;
  GrammarType grammarType_local;
  char *systemId_local;
  DOMLSParserImpl *this_local;
  
  bVar1 = AbstractDOMParser::getParseInProgress(&this->super_AbstractDOMParser);
  if (!bVar1) {
    JanitorMemFunCall<xercesc_4_0::DOMLSParserImpl>::JanitorMemFunCall
              ((JanitorMemFunCall<xercesc_4_0::DOMLSParserImpl> *)local_48,this,
               (MFPT)DOMLSParserImpl::resetParse);
    AbstractDOMParser::setParseInProgress(&this->super_AbstractDOMParser,true);
    if (grammarType == DTDGrammarType) {
      pXVar2 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
      XMLScanner::setDocTypeHandler(pXVar2,(DocTypeHandler *)0x0);
    }
    pXVar2 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
    local_1c = (short)grammarType;
    pGVar3 = XMLScanner::loadGrammar(pXVar2,systemId,local_1c,toCache);
    JanitorMemFunCall<xercesc_4_0::DOMLSParserImpl>::~JanitorMemFunCall
              ((JanitorMemFunCall<xercesc_4_0::DOMLSParserImpl> *)local_48);
    return pGVar3;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,0xb,0x21,(this->super_AbstractDOMParser).fMemoryManager);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

Grammar* DOMLSParserImpl::loadGrammar(const char* const systemId,
                                     const Grammar::GrammarType grammarType,
                                     const bool toCache)
{
    // Avoid multiple entrance
    if (getParseInProgress())
        throw DOMException(DOMException::INVALID_STATE_ERR, XMLDOMMsg::LSParser_ParseInProgress, fMemoryManager);

    ResetParseType  resetParse(this, &DOMLSParserImpl::resetParse);

	Grammar* grammar = 0;

    try
    {
        setParseInProgress(true);
        if (grammarType == Grammar::DTDGrammarType)
            getScanner()->setDocTypeHandler(0);
        grammar = getScanner()->loadGrammar(systemId, grammarType, toCache);
    }
    catch(const OutOfMemoryException&)
    {
        resetParse.release();

        throw;
    }

    return grammar;
}